

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

void __thiscall soul::AST::ImportsList::addIfNotAlreadyThere(ImportsList *this,string *newImport)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string local_60;
  string local_40;
  
  pcVar1 = (newImport->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + newImport->_M_string_length);
  choc::text::trim(&local_40,&local_60);
  std::__cxx11::string::operator=((string *)newImport,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  pbVar2 = (this->imports).items;
  pbVar2 = std::
           __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                     (pbVar2,pbVar2 + (this->imports).numActive,newImport);
  if (pbVar2 == (this->imports).items + (this->imports).numActive) {
    ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
    ::push_back(&this->imports,newImport);
  }
  return;
}

Assistant:

void addIfNotAlreadyThere (std::string newImport)
        {
            newImport = choc::text::trim (newImport);

            if (! contains (imports, newImport))
                imports.push_back (newImport);
        }